

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::compute_tapleaf::test_method(compute_tapleaf *this)

{
  long lVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  uint256 *__return_storage_ptr__;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  Span<const_unsigned_char> script_00;
  Span<const_unsigned_char> script_01;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  uint8_t script [6];
  uint256 local_98;
  uint256 tlc2;
  uint256 tlc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  builtin_memcpy(script,"foobar",6);
  tlc0.super_base_blob<256U>.m_data._M_elems[0x10] = '{';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x11] = '\x02';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x12] = 0xb9;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x13] = '\x05';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x14] = 0xd6;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x15] = '\x11';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x16] = 0xcc;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x17] = 0xcd;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x18] = ']';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x19] = '!';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1a] = 0xa1;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1b] = 'r';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1c] = 0xc2;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1d] = '\x10';
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1e] = 0xbc;
  tlc0.super_base_blob<256U>.m_data._M_elems[0x1f] = 0xed;
  tlc0.super_base_blob<256U>.m_data._M_elems[0] = '\x06';
  tlc0.super_base_blob<256U>.m_data._M_elems[1] = 0x9c;
  tlc0.super_base_blob<256U>.m_data._M_elems[2] = '[';
  tlc0.super_base_blob<256U>.m_data._M_elems[3] = '{';
  tlc0.super_base_blob<256U>.m_data._M_elems[4] = 'v';
  tlc0.super_base_blob<256U>.m_data._M_elems[5] = '6';
  tlc0.super_base_blob<256U>.m_data._M_elems[6] = 0xf1;
  tlc0.super_base_blob<256U>.m_data._M_elems[7] = '\x03';
  tlc0.super_base_blob<256U>.m_data._M_elems[8] = '\x12';
  tlc0.super_base_blob<256U>.m_data._M_elems[9] = 'R';
  tlc0.super_base_blob<256U>.m_data._M_elems[10] = 'E';
  tlc0.super_base_blob<256U>.m_data._M_elems[0xb] = 0xcd;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xc] = 0x97;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xd] = 0xed;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xe] = 0xd6;
  tlc0.super_base_blob<256U>.m_data._M_elems[0xf] = 'Z';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x10] = 0xf0;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x11] = 0x9d;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x12] = 0xa5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x13] = 0xd8;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x14] = 0xf5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x15] = 0xbe;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x16] = 0x9d;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x17] = '%';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x18] = 'n';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x19] = 0xf7;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1a] = 'k';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1b] = 0xae;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1c] = 0x90;
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1d] = 'O';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1e] = '\\';
  tlc2.super_base_blob<256U>.m_data._M_elems[0x1f] = 0x8b;
  tlc2.super_base_blob<256U>.m_data._M_elems[0] = 'z';
  tlc2.super_base_blob<256U>.m_data._M_elems[1] = 0xb2;
  tlc2.super_base_blob<256U>.m_data._M_elems[2] = 'Q';
  tlc2.super_base_blob<256U>.m_data._M_elems[3] = 'd';
  tlc2.super_base_blob<256U>.m_data._M_elems[4] = 0xa7;
  tlc2.super_base_blob<256U>.m_data._M_elems[5] = 0xec;
  tlc2.super_base_blob<256U>.m_data._M_elems[6] = '%';
  tlc2.super_base_blob<256U>.m_data._M_elems[7] = '\x1b';
  tlc2.super_base_blob<256U>.m_data._M_elems[8] = 't';
  tlc2.super_base_blob<256U>.m_data._M_elems[9] = 'c';
  tlc2.super_base_blob<256U>.m_data._M_elems[10] = 0x92;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xb] = 0xb5;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xc] = 0x91;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xd] = 0xc3;
  tlc2.super_base_blob<256U>.m_data._M_elems[0xe] = 'Y';
  tlc2.super_base_blob<256U>.m_data._M_elems[0xf] = 'c';
  local_b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x6bc;
  file.m_begin = (iterator)&local_b0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01139f30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_e8 = "";
  __return_storage_ptr__ = &local_98;
  script_00.m_size = 6;
  script_00.m_data = script;
  ComputeTapleafHash(__return_storage_ptr__,0xc0,script_00);
  pvVar2 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_e0,&local_f0,0x6bc,1,2,__return_storage_ptr__,
             "ComputeTapleafHash(0xc0, Span(script))",&tlc0,"tlc0");
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)__return_storage_ptr__;
  msg_00.m_begin = pvVar2;
  file_00.m_end = (iterator)0x6bd;
  file_00.m_begin = (iterator)&local_100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_01139f30;
  local_d0 = boost::unit_test::lazy_ostream::inst;
  local_c8 = "";
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
  ;
  local_118 = "";
  script_01.m_size = 6;
  script_01.m_data = script;
  ComputeTapleafHash(&local_98,0xc2,script_01);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
            (&local_e0,&local_120,0x6bd,1,2,&local_98,"ComputeTapleafHash(0xc2, Span(script))",&tlc2
             ,"tlc2");
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(compute_tapleaf)
{
    constexpr uint8_t script[6] = {'f','o','o','b','a','r'};
    constexpr uint256 tlc0{"edbc10c272a1215dcdcc11d605b9027b5ad6ed97cd45521203f136767b5b9c06"};
    constexpr uint256 tlc2{"8b5c4f90ae6bf76e259dbef5d8a59df06359c391b59263741b25eca76451b27a"};

    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc0, Span(script)), tlc0);
    BOOST_CHECK_EQUAL(ComputeTapleafHash(0xc2, Span(script)), tlc2);
}